

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cc
# Opt level: O3

void __thiscall dnet::data_types::matrix::matrix(matrix *this,double def,axes_type *size)

{
  pointer pdVar1;
  pointer pdVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  ulong uVar5;
  ulong uVar6;
  vector<double,_std::allocator<double>_> *__range2;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  
  tensor<double,_2U>::tensor
            (&this->super_tensor<double,_2U>,(array<unsigned_int,_2UL>)*&size->_M_elems);
  auVar4 = _DAT_00137910;
  auVar3 = _DAT_00137900;
  pdVar1 = (this->super_tensor<double,_2U>)._data.
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_start;
  pdVar2 = (this->super_tensor<double,_2U>)._data.
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_finish;
  if (pdVar1 != pdVar2) {
    uVar5 = (long)pdVar2 + (-8 - (long)pdVar1);
    auVar9._8_4_ = (int)uVar5;
    auVar9._0_8_ = uVar5;
    auVar9._12_4_ = (int)(uVar5 >> 0x20);
    auVar7._0_8_ = uVar5 >> 3;
    auVar7._8_8_ = auVar9._8_8_ >> 3;
    uVar6 = 0;
    auVar7 = auVar7 ^ _DAT_00137910;
    do {
      auVar8._8_4_ = (int)uVar6;
      auVar8._0_8_ = uVar6;
      auVar8._12_4_ = (int)(uVar6 >> 0x20);
      auVar9 = (auVar8 | auVar3) ^ auVar4;
      if ((bool)(~(auVar9._4_4_ == auVar7._4_4_ && auVar7._0_4_ < auVar9._0_4_ ||
                  auVar7._4_4_ < auVar9._4_4_) & 1)) {
        pdVar1[uVar6] = def;
      }
      if ((auVar9._12_4_ != auVar7._12_4_ || auVar9._8_4_ <= auVar7._8_4_) &&
          auVar9._12_4_ <= auVar7._12_4_) {
        pdVar1[uVar6 + 1] = def;
      }
      uVar6 = uVar6 + 2;
    } while (((uVar5 >> 3) + 2 & 0xfffffffffffffffe) != uVar6);
  }
  return;
}

Assistant:

matrix::matrix(double def, const axes_type &size) : tensor(def, size) {}